

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sse2.c
# Opt level: O0

void SetResidualCoeffs_SSE2(int16_t *coeffs,VP8Residual *res)

{
  ulong uVar1;
  uint n;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar2 [16];
  uint32_t mask;
  __m128i m1;
  __m128i m0;
  __m128i zero;
  __m128i c1;
  __m128i c0;
  int local_e0;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  
  auVar2 = packsswb(*in_RDI,in_RDI[1]);
  local_28 = auVar2[0];
  cStack_27 = auVar2[1];
  cStack_26 = auVar2[2];
  cStack_25 = auVar2[3];
  cStack_24 = auVar2[4];
  cStack_23 = auVar2[5];
  cStack_22 = auVar2[6];
  cStack_21 = auVar2[7];
  cStack_20 = auVar2[8];
  cStack_1f = auVar2[9];
  cStack_1e = auVar2[10];
  cStack_1d = auVar2[0xb];
  cStack_1c = auVar2[0xc];
  cStack_1b = auVar2[0xd];
  cStack_1a = auVar2[0xe];
  cStack_19 = auVar2[0xf];
  auVar2[1] = -(cStack_27 == '\0');
  auVar2[0] = -(local_28 == '\0');
  auVar2[2] = -(cStack_26 == '\0');
  auVar2[3] = -(cStack_25 == '\0');
  auVar2[4] = -(cStack_24 == '\0');
  auVar2[5] = -(cStack_23 == '\0');
  auVar2[6] = -(cStack_22 == '\0');
  auVar2[7] = -(cStack_21 == '\0');
  uVar1 = CONCAT17(-(cStack_19 == '\0'),
                   CONCAT16(-(cStack_1a == '\0'),
                            CONCAT15(-(cStack_1b == '\0'),
                                     CONCAT14(-(cStack_1c == '\0'),
                                              CONCAT13(-(cStack_1d == '\0'),
                                                       CONCAT12(-(cStack_1e == '\0'),
                                                                CONCAT11(-(cStack_1f == '\0'),
                                                                         -(cStack_20 == '\0'))))))))
  ;
  auVar2._8_8_ = uVar1;
  n = (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 | (ushort)((byte)(uVar1 >> 7) & 1) << 8 |
               (ushort)((byte)(uVar1 >> 0xf) & 1) << 9 | (ushort)((byte)(uVar1 >> 0x17) & 1) << 10 |
               (ushort)((byte)(uVar1 >> 0x1f) & 1) << 0xb |
               (ushort)((byte)(uVar1 >> 0x27) & 1) << 0xc |
               (ushort)((byte)(uVar1 >> 0x2f) & 1) << 0xd |
               (ushort)((byte)(uVar1 >> 0x37) & 1) << 0xe |
              (ushort)((byte)-(cStack_19 == '\0') >> 7) << 0xf) ^ 0xffff;
  if (n == 0) {
    local_e0 = -1;
  }
  else {
    local_e0 = BitsLog2Floor(n);
  }
  *(int *)(in_RSI + 4) = local_e0;
  *(undefined1 (**) [16])(in_RSI + 8) = in_RDI;
  return;
}

Assistant:

static void SetResidualCoeffs_SSE2(const int16_t* WEBP_RESTRICT const coeffs,
                                   VP8Residual* WEBP_RESTRICT const res) {
  const __m128i c0 = _mm_loadu_si128((const __m128i*)(coeffs + 0));
  const __m128i c1 = _mm_loadu_si128((const __m128i*)(coeffs + 8));
  // Use SSE2 to compare 16 values with a single instruction.
  const __m128i zero = _mm_setzero_si128();
  const __m128i m0 = _mm_packs_epi16(c0, c1);
  const __m128i m1 = _mm_cmpeq_epi8(m0, zero);
  // Get the comparison results as a bitmask into 16bits. Negate the mask to get
  // the position of entries that are not equal to zero. We don't need to mask
  // out least significant bits according to res->first, since coeffs[0] is 0
  // if res->first > 0.
  const uint32_t mask = 0x0000ffffu ^ (uint32_t)_mm_movemask_epi8(m1);
  // The position of the most significant non-zero bit indicates the position of
  // the last non-zero value.
  assert(res->first == 0 || coeffs[0] == 0);
  res->last = mask ? BitsLog2Floor(mask) : -1;
  res->coeffs = coeffs;
}